

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O2

bool iDynTree::computeLinkNetWrenchesWithoutGravity
               (Model *model,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               LinkNetTotalWrenchesWithoutGravity *linkNetWrenchesWithoutGravity)

{
  long lVar1;
  Twist *pTVar2;
  SpatialMomentum *pSVar3;
  Wrench *this;
  long lVar4;
  Wrench local_110;
  Wrench local_d8;
  SpatialInertia local_a0 [56];
  Twist local_68 [56];
  
  lVar4 = 0;
  while( true ) {
    lVar1 = iDynTree::Model::getNrOfLinks();
    if (lVar1 <= lVar4) break;
    iDynTree::Model::getLink((long)model);
    pTVar2 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(linkProperAcc,lVar4);
    pSVar3 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,lVar4);
    iDynTree::SpatialInertia::operator*((SpatialInertia *)&local_110,(SpatialAcc *)pTVar2);
    iDynTree::SpatialInertia::operator*(local_a0,pTVar2);
    iDynTree::Twist::operator*(local_68,pSVar3);
    iDynTree::Wrench::operator+(&local_d8,&local_110);
    this = (Wrench *)iDynTree::LinkWrenches::operator()(linkNetWrenchesWithoutGravity,lVar4);
    iDynTree::Wrench::operator=(this,(Wrench *)&local_d8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_d8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_a0);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_110.super_SpatialForceVector);
    lVar4 = lVar4 + 1;
  }
  return true;
}

Assistant:

bool computeLinkNetWrenchesWithoutGravity(const Model& model,
                                          const LinkVelArray& linkVel,
                                          const LinkAccArray& linkProperAcc,
                                                LinkNetTotalWrenchesWithoutGravity& linkNetWrenchesWithoutGravity)
{
     // Note that we are not using a Traversal here: the main reason
     // is that given that the computation that we are doing (once we have the linkVel and linkProperAcc
     // does not depend on the topology, so we can visit the links in any possible order
     for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model.getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = model.getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return true;
}